

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoMocUic.cxx
# Opt level: O1

void __thiscall cmQtAutoMocUic::cmQtAutoMocUic(cmQtAutoMocUic *this)

{
  _Rb_tree_header *p_Var1;
  
  cmQtAutoGenerator::cmQtAutoGenerator(&this->super_cmQtAutoGenerator);
  (this->super_cmQtAutoGenerator)._vptr_cmQtAutoGenerator =
       (_func_int **)&PTR__cmQtAutoMocUic_00673968;
  cmQtAutoGenerator::Logger::Logger(&this->Logger_);
  BaseSettingsT::BaseSettingsT(&this->BaseConst_);
  (this->BaseEval_).ParseCacheChanged = false;
  (this->BaseEval_).ParseCacheTime.NS = 0;
  (this->BaseEval_).ParseCache.Map_._M_h._M_buckets =
       &(this->BaseEval_).ParseCache.Map_._M_h._M_single_bucket;
  (this->BaseEval_).ParseCache.Map_._M_h._M_bucket_count = 1;
  (this->BaseEval_).ParseCache.Map_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->BaseEval_).ParseCache.Map_._M_h._M_element_count = 0;
  (this->BaseEval_).ParseCache.Map_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->BaseEval_).ParseCache.Map_._M_h._M_rehash_policy._M_next_resize = 0;
  (this->BaseEval_).ParseCache.Map_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->BaseEval_).Headers._M_t._M_impl.super__Rb_tree_header;
  (this->BaseEval_).Headers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->BaseEval_).Headers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->BaseEval_).Headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->BaseEval_).Headers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->BaseEval_).Headers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->BaseEval_).Sources._M_t._M_impl.super__Rb_tree_header;
  (this->BaseEval_).Sources._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->BaseEval_).Sources._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->BaseEval_).Sources._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->BaseEval_).Sources._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->BaseEval_).Sources._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  MocSettingsT::MocSettingsT(&this->MocConst_);
  (this->MocEval_).PredefsTime.NS = 0;
  p_Var1 = &(this->MocEval_).HeaderMappings._M_t._M_impl.super__Rb_tree_header;
  (this->MocEval_).HeaderMappings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->MocEval_).HeaderMappings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->MocEval_).HeaderMappings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->MocEval_).HeaderMappings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->MocEval_).HeaderMappings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->MocEval_).SourceMappings._M_t._M_impl.super__Rb_tree_header;
  (this->MocEval_).SourceMappings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->MocEval_).SourceMappings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->MocEval_).SourceMappings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->MocEval_).SourceMappings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->MocEval_).SourceMappings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->MocEval_).Includes._M_t._M_impl.super__Rb_tree_header;
  (this->MocEval_).Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->MocEval_).Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->MocEval_).Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->MocEval_).Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->MocEval_).Includes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->MocEval_).HeadersDiscovered._M_t._M_impl.super__Rb_tree_header;
  (this->MocEval_).HeadersDiscovered._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->MocEval_).HeadersDiscovered._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->MocEval_).HeadersDiscovered._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->MocEval_).HeadersDiscovered._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->MocEval_).HeadersDiscovered._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->MocEval_).CompUpdated = false;
  (this->MocEval_).CompFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->MocEval_).CompFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->MocEval_).CompFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  UicSettingsT::UicSettingsT(&this->UicConst_);
  p_Var1 = &(this->UicEval_).UiFiles._M_t._M_impl.super__Rb_tree_header;
  (this->UicEval_).UiFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->UicEval_).UiFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->UicEval_).UiFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->UicEval_).UiFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->UicEval_).UiFiles._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->UicEval_).Includes._M_t._M_impl.super__Rb_tree_header;
  (this->UicEval_).Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->UicEval_).Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->UicEval_).Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->UicEval_).Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->UicEval_).Includes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->SettingsFile_)._M_dataplus._M_p = (pointer)&(this->SettingsFile_).field_2;
  (this->SettingsFile_)._M_string_length = 0;
  (this->SettingsFile_).field_2._M_local_buf[0] = '\0';
  (this->SettingsStringMoc_)._M_dataplus._M_p = (pointer)&(this->SettingsStringMoc_).field_2;
  (this->SettingsStringMoc_)._M_string_length = 0;
  (this->SettingsStringMoc_).field_2._M_local_buf[0] = '\0';
  (this->SettingsStringUic_)._M_dataplus._M_p = (pointer)&(this->SettingsStringUic_).field_2;
  (this->SettingsStringUic_)._M_string_length = 0;
  (this->SettingsStringUic_).field_2._M_local_buf[0] = '\0';
  (this->JobError_)._M_base._M_i = false;
  cmWorkerPool::cmWorkerPool(&this->WorkerPool_);
  return;
}

Assistant:

cmQtAutoMocUic::cmQtAutoMocUic() = default;